

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::apply::test(apply *this)

{
  allocator<char> local_a81;
  string local_a80;
  string local_a60;
  allocator<char> local_a39;
  string local_a38;
  string local_a18;
  allocator<char> local_9f1;
  string local_9f0;
  string local_9d0;
  allocator<char> local_9a9;
  string local_9a8;
  string local_988;
  allocator<char> local_961;
  string local_960;
  string local_940;
  allocator<char> local_919;
  string local_918;
  string local_8f8;
  allocator<char> local_8d1;
  string local_8d0;
  string local_8b0;
  allocator<char> local_889;
  string local_888;
  string local_868;
  allocator<char> local_841;
  string local_840;
  string local_820;
  allocator<char> local_7f9;
  string local_7f8;
  string local_7d8;
  allocator<char> local_7b1;
  string local_7b0;
  string local_790;
  allocator<char> local_769;
  string local_768;
  string local_748;
  allocator<char> local_721;
  string local_720;
  string local_700;
  allocator<char> local_6d9;
  string local_6d8;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  string local_670;
  allocator<char> local_649;
  string local_648;
  string local_628;
  allocator<char> local_601;
  string local_600;
  string local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  string local_598;
  allocator<char> local_571;
  string local_570;
  string local_550;
  allocator<char> local_529;
  string local_528;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  string local_478;
  allocator<char> local_451;
  string local_450;
  string local_430;
  allocator<char> local_409;
  string local_408;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  string local_358;
  allocator<char> local_331;
  string local_330;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  allocator<char> local_211;
  string local_210;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  string local_160;
  allocator<char> local_139;
  string local_138;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  allocator<char> local_51;
  string local_50;
  string local_30;
  apply *local_10;
  apply *this_local;
  
  local_10 = this;
  compile_fixture::build_string_to_symbol(&this->super_compile_fixture);
  compile_fixture::build_apply(&this->super_compile_fixture);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"(apply + ())",&local_51);
  compile_fixture::run(&local_30,&this->super_compile_fixture,&local_50,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xcfe,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"(apply + (list 3 4))",&local_a9);
  compile_fixture::run(&local_88,&this->super_compile_fixture,&local_a8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("7",&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xcff,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"(apply + (list 1 2 3 4))",&local_f1);
  compile_fixture::run(&local_d0,&this->super_compile_fixture,&local_f0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("10",&local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd00,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"(apply + 1 2 (list 3 4))",&local_139);
  compile_fixture::run(&local_118,&this->super_compile_fixture,&local_138,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("10",&local_118,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd01,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"(apply + (list 1 2 3 4 5 6 7 8))",&local_181);
  compile_fixture::run(&local_160,&this->super_compile_fixture,&local_180,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("36",&local_160,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd02,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"(apply + (list 1 2 3 4 5 6 7 8 9))",&local_1c9);
  compile_fixture::run(&local_1a8,&this->super_compile_fixture,&local_1c8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("45",&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd03,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"(apply + (list 1 2 3 4 5 6 7 8 9 10))",&local_211);
  compile_fixture::run(&local_1f0,&this->super_compile_fixture,&local_210,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("55",&local_1f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd04,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"(%apply + 1 2 3 4 5 6 7 8 9 (list 10))",&local_259);
  compile_fixture::run(&local_238,&this->super_compile_fixture,&local_258,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("55",&local_238,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd05,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"(cons(apply vector \'(1 2 3 4 5 6 7 8)) \'())",&local_2a1);
  compile_fixture::run(&local_280,&this->super_compile_fixture,&local_2a0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(#(1 2 3 4 5 6 7 8))",&local_280,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd07,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"(cons(apply vector 1 \'(2 3 4 5 6 7 8)) \'())",&local_2e9);
  compile_fixture::run(&local_2c8,&this->super_compile_fixture,&local_2e8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(#(1 2 3 4 5 6 7 8))",&local_2c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd08,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"(cons(apply vector 1 2 \'(3 4 5 6 7 8)) \'())",&local_331);
  compile_fixture::run(&local_310,&this->super_compile_fixture,&local_330,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(#(1 2 3 4 5 6 7 8))",&local_310,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd09,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"(cons(apply vector 1 2 3 \'(4 5 6 7 8)) \'())",&local_379);
  compile_fixture::run(&local_358,&this->super_compile_fixture,&local_378,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(#(1 2 3 4 5 6 7 8))",&local_358,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd0a,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,"(cons(apply vector 1 2 3 4 \'(5 6 7 8)) \'())",&local_3c1);
  compile_fixture::run(&local_3a0,&this->super_compile_fixture,&local_3c0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(#(1 2 3 4 5 6 7 8))",&local_3a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd0b,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,"(cons(apply vector 1 2 3 4 5 \'(6 7 8)) \'())",&local_409);
  compile_fixture::run(&local_3e8,&this->super_compile_fixture,&local_408,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(#(1 2 3 4 5 6 7 8))",&local_3e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd0c,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"(cons(apply vector 1 2 3 4 5 6 \'(7 8)) \'())",&local_451);
  compile_fixture::run(&local_430,&this->super_compile_fixture,&local_450,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(#(1 2 3 4 5 6 7 8))",&local_430,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd0d,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,"(cons(apply vector 1 2 3 4 5 6 7 \'(8)) \'())",&local_499);
  compile_fixture::run(&local_478,&this->super_compile_fixture,&local_498,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(#(1 2 3 4 5 6 7 8))",&local_478,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd0e,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator(&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e0,"(cons(apply vector 1 2 3 4 5 6 7 8 ()) \'())",&local_4e1);
  compile_fixture::run(&local_4c0,&this->super_compile_fixture,&local_4e0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("(#(1 2 3 4 5 6 7 8))",&local_4c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd0f,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"(let([f(lambda() 12)])( + (apply f \'()) 1))",&local_529);
  compile_fixture::run(&local_508,&this->super_compile_fixture,&local_528,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("13",&local_508,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd11,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_570,"(let([f(lambda(x) ( + x 12))]) ( + (apply f 13 \'()) 1))",
             &local_571);
  compile_fixture::run(&local_550,&this->super_compile_fixture,&local_570,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("26",&local_550,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd12,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator(&local_571);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,"(let([f(lambda(x) ( + x 12))]) ( + (apply f(cons 13 \'())) 1))",
             &local_5b9);
  compile_fixture::run(&local_598,&this->super_compile_fixture,&local_5b8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("26",&local_598,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd13,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_600,
             "(let([f(lambda(x y z) ( + x(* y z)))])( + (apply f 12 \'(7 2)) 1))",&local_601);
  compile_fixture::run(&local_5e0,&this->super_compile_fixture,&local_600,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("27",&local_5e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd14,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator(&local_601);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_648,"(let([f(lambda() 12)])(apply f \'()))",&local_649);
  compile_fixture::run(&local_628,&this->super_compile_fixture,&local_648,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("12",&local_628,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd16,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator(&local_649);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_690,"(let([f(lambda(x) ( + x 12))])(apply f 13 \'()))",&local_691);
  compile_fixture::run(&local_670,&this->super_compile_fixture,&local_690,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("25",&local_670,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd17,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d8,"(let([f(lambda(x) ( + x 12))])(apply f(cons 13 \'())))",
             &local_6d9);
  compile_fixture::run(&local_6b8,&this->super_compile_fixture,&local_6d8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("25",&local_6b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd18,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator(&local_6d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,"(let([f(lambda(x y z) ( + x(* y z)))])(apply f 12 \'(7 2)))",
             &local_721);
  compile_fixture::run(&local_700,&this->super_compile_fixture,&local_720,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("26",&local_700,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd19,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_700);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator(&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_768,"(apply vector \'(1 2 3 4 5 6 7 8))",&local_769);
  compile_fixture::run(&local_748,&this->super_compile_fixture,&local_768,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#(1 2 3 4 5 6 7 8)",&local_748,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd1a,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_768);
  std::allocator<char>::~allocator(&local_769);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7b0,"(apply vector 1 \'(2 3 4 5 6 7 8))",&local_7b1);
  compile_fixture::run(&local_790,&this->super_compile_fixture,&local_7b0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#(1 2 3 4 5 6 7 8)",&local_790,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd1b,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::allocator<char>::~allocator(&local_7b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f8,"(apply vector 1 2 \'(3 4 5 6 7 8)) ",&local_7f9);
  compile_fixture::run(&local_7d8,&this->super_compile_fixture,&local_7f8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#(1 2 3 4 5 6 7 8)",&local_7d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd1c,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_7d8);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_840,"(apply vector 1 2 3 \'(4 5 6 7 8)) ",&local_841);
  compile_fixture::run(&local_820,&this->super_compile_fixture,&local_840,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#(1 2 3 4 5 6 7 8)",&local_820,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd1d,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_820);
  std::__cxx11::string::~string((string *)&local_840);
  std::allocator<char>::~allocator(&local_841);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_888,"(apply vector 1 2 3 4 \'(5 6 7 8)) ",&local_889);
  compile_fixture::run(&local_868,&this->super_compile_fixture,&local_888,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#(1 2 3 4 5 6 7 8)",&local_868,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd1e,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&local_888);
  std::allocator<char>::~allocator(&local_889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8d0,"(apply vector 1 2 3 4 5 \'(6 7 8)) ",&local_8d1);
  compile_fixture::run(&local_8b0,&this->super_compile_fixture,&local_8d0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#(1 2 3 4 5 6 7 8)",&local_8b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd1f,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_8b0);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::allocator<char>::~allocator(&local_8d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_918,"(apply vector 1 2 3 4 5 6 \'(7 8)) ",&local_919);
  compile_fixture::run(&local_8f8,&this->super_compile_fixture,&local_918,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#(1 2 3 4 5 6 7 8)",&local_8f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd20,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_8f8);
  std::__cxx11::string::~string((string *)&local_918);
  std::allocator<char>::~allocator(&local_919);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_960,"(apply vector 1 2 3 4 5 6 7 \'(8)) ",&local_961);
  compile_fixture::run(&local_940,&this->super_compile_fixture,&local_960,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#(1 2 3 4 5 6 7 8)",&local_940,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd21,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_940);
  std::__cxx11::string::~string((string *)&local_960);
  std::allocator<char>::~allocator(&local_961);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9a8,"(apply vector 1 2 3 4 5 6 7 8 ())",&local_9a9);
  compile_fixture::run(&local_988,&this->super_compile_fixture,&local_9a8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#(1 2 3 4 5 6 7 8)",&local_988,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd22,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_988);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::allocator<char>::~allocator(&local_9a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9f0,"(define compose (lambda(f g)(lambda args(f(apply g args)))))",
             &local_9f1);
  compile_fixture::run(&local_9d0,&this->super_compile_fixture,&local_9f0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("<lambda>",&local_9d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd25,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_9d0);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::allocator<char>::~allocator(&local_9f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a38,"(define twice (lambda (x) (* 2 x)))",&local_a39);
  compile_fixture::run(&local_a18,&this->super_compile_fixture,&local_a38,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("<lambda>",&local_a18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd26,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_a18);
  std::__cxx11::string::~string((string *)&local_a38);
  std::allocator<char>::~allocator(&local_a39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a80,"((compose twice *) 12 75)",&local_a81);
  compile_fixture::run(&local_a60,&this->super_compile_fixture,&local_a80,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("1800",&local_a60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd27,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_a60);
  std::__cxx11::string::~string((string *)&local_a80);
  std::allocator<char>::~allocator(&local_a81);
  return;
}

Assistant:

void test()
      {
      build_string_to_symbol();
      build_apply();
      TEST_EQ("0", run("(apply + ())"));
      TEST_EQ("7", run("(apply + (list 3 4))"));
      TEST_EQ("10", run("(apply + (list 1 2 3 4))"));
      TEST_EQ("10", run("(apply + 1 2 (list 3 4))"));
      TEST_EQ("36", run("(apply + (list 1 2 3 4 5 6 7 8))"));
      TEST_EQ("45", run("(apply + (list 1 2 3 4 5 6 7 8 9))"));
      TEST_EQ("55", run("(apply + (list 1 2 3 4 5 6 7 8 9 10))"));
      TEST_EQ("55", run("(%apply + 1 2 3 4 5 6 7 8 9 (list 10))"));

      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector '(1 2 3 4 5 6 7 8)) '())"));
      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector 1 '(2 3 4 5 6 7 8)) '())"));
      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector 1 2 '(3 4 5 6 7 8)) '())"));
      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector 1 2 3 '(4 5 6 7 8)) '())"));
      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector 1 2 3 4 '(5 6 7 8)) '())"));
      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector 1 2 3 4 5 '(6 7 8)) '())"));
      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector 1 2 3 4 5 6 '(7 8)) '())"));
      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector 1 2 3 4 5 6 7 '(8)) '())"));
      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector 1 2 3 4 5 6 7 8 ()) '())"));

      TEST_EQ("13", run("(let([f(lambda() 12)])( + (apply f '()) 1))"));
      TEST_EQ("26", run("(let([f(lambda(x) ( + x 12))]) ( + (apply f 13 '()) 1))"));
      TEST_EQ("26", run("(let([f(lambda(x) ( + x 12))]) ( + (apply f(cons 13 '())) 1))"));
      TEST_EQ("27", run("(let([f(lambda(x y z) ( + x(* y z)))])( + (apply f 12 '(7 2)) 1))"));

      TEST_EQ("12", run("(let([f(lambda() 12)])(apply f '()))"));
      TEST_EQ("25", run("(let([f(lambda(x) ( + x 12))])(apply f 13 '()))"));
      TEST_EQ("25", run("(let([f(lambda(x) ( + x 12))])(apply f(cons 13 '())))"));
      TEST_EQ("26", run("(let([f(lambda(x y z) ( + x(* y z)))])(apply f 12 '(7 2)))"));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector '(1 2 3 4 5 6 7 8))"));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector 1 '(2 3 4 5 6 7 8))"));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector 1 2 '(3 4 5 6 7 8)) "));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector 1 2 3 '(4 5 6 7 8)) "));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector 1 2 3 4 '(5 6 7 8)) "));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector 1 2 3 4 5 '(6 7 8)) "));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector 1 2 3 4 5 6 '(7 8)) "));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector 1 2 3 4 5 6 7 '(8)) "));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector 1 2 3 4 5 6 7 8 ())"));


      TEST_EQ("<lambda>", run("(define compose (lambda(f g)(lambda args(f(apply g args)))))"));
      TEST_EQ("<lambda>", run("(define twice (lambda (x) (* 2 x)))"));
      TEST_EQ("1800", run("((compose twice *) 12 75)"));
      }